

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O0

kvtree_elem * kvtree_elem_extract_int(kvtree *hash,int key)

{
  kvtree_elem *pkVar1;
  kvtree_elem *elem;
  char tmp [100];
  int key_local;
  kvtree *hash_local;
  
  tmp._92_4_ = key;
  unique0x100000e0 = hash;
  sprintf((char *)&elem,"%d",(ulong)(uint)key);
  pkVar1 = kvtree_elem_get(stack0xfffffffffffffff0,(char *)&elem);
  if (pkVar1 != (kvtree_elem *)0x0) {
    if ((pkVar1->pointers).le_next != (kvtree_elem_struct *)0x0) {
      (((pkVar1->pointers).le_next)->pointers).le_prev = (pkVar1->pointers).le_prev;
    }
    *(pkVar1->pointers).le_prev = (pkVar1->pointers).le_next;
  }
  return pkVar1;
}

Assistant:

kvtree_elem* kvtree_elem_extract_int(kvtree* hash, int key)
{
  char tmp[100];
  sprintf(tmp, "%d", key);

  kvtree_elem* elem = kvtree_elem_get(hash, tmp);
  if (elem != NULL) {
    LIST_REMOVE(elem, pointers);
  }
  return elem;
}